

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall
TasGrid::TasmanianSparseGrid::evaluateHierarchicalFunctions
          (TasmanianSparseGrid *this,vector<double,_std::allocator<double>_> *x,
          vector<double,_std::allocator<double>_> *y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  runtime_error *this_00;
  size_type sVar4;
  double *x_00;
  double *y_00;
  int iVar5;
  size_t expected_size;
  size_t num_x;
  int num_points;
  vector<double,_std::allocator<double>_> *y_local;
  vector<double,_std::allocator<double>_> *x_local;
  TasmanianSparseGrid *this_local;
  
  bVar1 = empty(this);
  if (!bVar1) {
    iVar2 = getNumPoints(this);
    sVar4 = ::std::vector<double,_std::allocator<double>_>::size(x);
    iVar3 = getNumDimensions(this);
    bVar1 = isFourier(this);
    iVar5 = 1;
    if (bVar1) {
      iVar5 = 2;
    }
    ::std::vector<double,_std::allocator<double>_>::resize
              (y,(long)iVar2 * (sVar4 / (ulong)(long)iVar3) * (long)iVar5);
    x_00 = ::std::vector<double,_std::allocator<double>_>::data(x);
    y_00 = ::std::vector<double,_std::allocator<double>_>::data(y);
    evaluateHierarchicalFunctions(this,x_00,(int)(sVar4 / (ulong)(long)iVar3),y_00);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error
            (this_00,"ERROR: cannot call evaluateHierarchicalFunctions() on an empty grid");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TasmanianSparseGrid::evaluateHierarchicalFunctions(const std::vector<double> &x, std::vector<double> &y) const{
    if (empty()) throw std::runtime_error("ERROR: cannot call evaluateHierarchicalFunctions() on an empty grid");
    int num_points = getNumPoints();
    size_t num_x = x.size() / getNumDimensions();
    size_t expected_size = num_points * num_x * (isFourier() ? 2 : 1);
    y.resize(expected_size);
    evaluateHierarchicalFunctions(x.data(), (int) num_x, y.data());
}